

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supercell.cpp
# Opt level: O2

void CIF::calculateTiling
               (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *basis,double x_width,double y_width,double z_width,Vector3i *mins,Vector3i *maxs)

{
  double dVar1;
  double dVar2;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar3;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *pCVar4;
  CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *pCVar5;
  Scalar *pSVar6;
  int i_1;
  int i;
  long lVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>
  PVar12;
  double z_width_local;
  double y_width_local;
  double x_width_local;
  MatrixXd affine_cube;
  Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>
  local_200;
  Scalar local_1e8;
  Scalar local_1e0;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> local_1d8;
  MatrixXd cuboid;
  Scalar local_170;
  Scalar local_168;
  Scalar local_160;
  Scalar local_158;
  Scalar local_150;
  Vector4d temp_row;
  MatrixXd affine_basis;
  Scalar local_108;
  Scalar local_100;
  Scalar local_f8;
  Scalar local_f0;
  Scalar local_e8;
  Scalar local_e0;
  Scalar local_d8;
  Scalar local_d0;
  Scalar local_c8;
  Scalar local_c0;
  Matrix4d real_basis;
  
  real_basis.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
       = (double)CONCAT44(real_basis.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[0]._4_4_,3);
  local_1d8.m_xpr = (Matrix<double,_4,_4,_0,_4,_4> *)CONCAT44(local_1d8.m_xpr._4_4_,4);
  z_width_local = z_width;
  y_width_local = y_width;
  x_width_local = x_width;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&affine_basis,(int *)&real_basis,(int *)&local_1d8);
  local_1d8.m_xpr = (Matrix<double,_4,_4,_0,_4,_4> *)0x0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&real_basis,
             (Matrix<double,__1,__1,_0,__1,__1> *)&affine_basis,(Scalar *)&local_1d8);
  temp_row.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       1.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&real_basis,
                      (Scalar *)&temp_row);
  cuboid.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,(Scalar *)&cuboid);
  affine_cube.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,(Scalar *)&affine_cube);
  local_200.m_lhs.m_lhs = (LhsNested)0x0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,(Scalar *)&local_200);
  local_1e0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_1e0);
  local_1e8 = 1.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_1e8);
  local_150 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_150);
  local_158 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_158);
  local_160 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_160);
  local_168 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_168);
  local_170 = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar3,&local_170);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&real_basis);
  local_1d8.m_row = 0;
  local_1d8.m_col = 1;
  local_1d8.m_currentBlockRows = 1;
  real_basis.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
       = 1.0;
  temp_row.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       1.0;
  local_1d8.m_xpr = (Matrix<double,_4,_4,_0,_4,_4> *)&real_basis;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (&local_1d8,(Scalar *)&temp_row);
  cuboid.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x3ff0000000000000;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar4,(Scalar *)&cuboid);
  affine_cube.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x3ff0000000000000;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar4,(Scalar *)&affine_cube);
  local_200.m_lhs.m_lhs = (LhsNested)0x0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar4,(Scalar *)&local_200);
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar4,(Scalar *)
                             (basis->
                             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar4,(Scalar *)
                             ((basis->
                              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1));
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar4,(Scalar *)
                             ((basis->
                              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 2));
  local_1e0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar4,&local_1e0);
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar4,(double *)
                             ((long)&(((basis->
                                       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                     m_storage.m_data + 8));
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar4,(double *)
                             ((long)&(basis->
                                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start[1].
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                     m_storage.m_data + 8));
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar4,(double *)
                             ((long)&(basis->
                                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start[2].
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                     m_storage.m_data + 8));
  local_1e8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar4,&local_1e8);
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar4,(double *)
                             ((long)&(((basis->
                                       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                     m_storage.m_data + 0x10));
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar4,(double *)
                             ((long)&(basis->
                                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start[1].
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                     m_storage.m_data + 0x10));
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
            (pCVar4,(double *)
                    ((long)&(basis->
                            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[2].
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                            m_data + 0x10));
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::finished(&local_1d8);
  local_1d8.m_xpr = (Matrix<double,_4,_4,_0,_4,_4> *)&real_basis;
  PVar12 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                     ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&affine_basis,
                      (MatrixBase<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_> *)
                      &local_1d8);
  local_1d8.m_xpr._0_4_ = 8;
  temp_row.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       (double)CONCAT44(temp_row.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                        m_storage.m_data.array[0]._4_4_,4);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&cuboid,(int *)&local_1d8,(int *)&temp_row);
  temp_row.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_1d8,&cuboid,
             (Scalar *)&temp_row);
  affine_cube.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_1d8,
                      (Scalar *)&affine_cube);
  local_200.m_lhs.m_lhs = (LhsNested)0x0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,(Scalar *)&local_200);
  local_1e0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_1e0);
  local_1e8 = 1.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_1e8);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&x_width_local);
  local_150 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_150);
  local_158 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_158);
  local_160 = 1.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_160);
  local_168 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_168);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&y_width_local);
  local_170 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_170);
  local_c0 = 1.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_c0);
  local_c8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_c8);
  local_d0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_d0);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&z_width_local);
  local_d8 = 1.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_d8);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&x_width_local);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&y_width_local);
  local_e0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_e0);
  local_e8 = 1.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_e8);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&x_width_local);
  local_f0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_f0);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&z_width_local);
  local_f8 = 1.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_f8);
  local_100 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_100);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&y_width_local);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&z_width_local);
  local_108 = 1.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_108);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&x_width_local);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&y_width_local);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
            (pCVar3,&z_width_local);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_1d8);
  local_1d8.m_xpr = (Matrix<double,_4,_4,_0,_4,_4> *)CONCAT44(local_1d8.m_xpr._4_4_,8);
  temp_row.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       (double)CONCAT44(temp_row.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                        m_storage.m_data.array[0]._4_4_,3);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&affine_cube,(int *)&local_1d8,(int *)&temp_row);
  for (lVar7 = 0;
      lVar7 < cuboid.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows; lVar7 = lVar7 + 1) {
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)&local_1d8,&cuboid,
               lVar7);
    Eigen::PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>> *)&temp_row,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *)
               &local_1d8);
    local_200.m_rhs = (RhsNested)&temp_row;
    local_200.m_lhs = PVar12;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)&local_1d8,
               &affine_cube,lVar7);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,0>,Eigen::Matrix<double,4,1,0,4,1>,0>>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)&local_1d8,
               &local_200);
  }
  local_1d8.m_row = 0;
  local_1d8.m_col = 1;
  local_1d8.m_currentBlockRows = 1;
  (maxs->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0] = 0;
  temp_row.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       (double)((ulong)temp_row.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                       m_storage.m_data.array[0] & 0xffffffff00000000);
  local_1d8.m_xpr = (Matrix<double,_4,_4,_0,_4,_4> *)maxs;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)&local_1d8,
                      (Scalar *)&temp_row);
  local_200.m_lhs.m_lhs = (LhsNested)((ulong)local_200.m_lhs.m_lhs & 0xffffffff00000000);
  Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_
            (pCVar5,(Scalar *)&local_200);
  Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)&local_1d8);
  local_1d8.m_row = 0;
  local_1d8.m_col = 1;
  local_1d8.m_currentBlockRows = 1;
  (mins->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0] = -1;
  temp_row.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       (double)CONCAT44(temp_row.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                        m_storage.m_data.array[0]._4_4_,0xffffffff);
  local_1d8.m_xpr = (Matrix<double,_4,_4,_0,_4,_4> *)mins;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)&local_1d8,
                      (Scalar *)&temp_row);
  local_200.m_lhs.m_lhs = (LhsNested)CONCAT44(local_200.m_lhs.m_lhs._4_4_,0xffffffff);
  Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_
            (pCVar5,(Scalar *)&local_200);
  Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)&local_1d8);
  for (lVar7 = 0;
      lVar7 < affine_cube.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
              .m_rows; lVar7 = lVar7 + 1) {
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&affine_cube
                        ,lVar7,0);
    dVar11 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&affine_cube
                        ,lVar7,0);
    dVar9 = ceil(ABS(*pSVar6));
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&affine_cube
                        ,lVar7,1);
    dVar1 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&affine_cube
                        ,lVar7,1);
    dVar10 = ceil(ABS(*pSVar6));
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&affine_cube
                        ,lVar7,2);
    dVar2 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&affine_cube
                        ,lVar7,2);
    lVar8 = (long)(dVar9 * (double)(int)((uint)(0.0 < dVar11) - (uint)(dVar11 < 0.0)));
    dVar11 = ceil(ABS(*pSVar6));
    if ((maxs->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0]
        < lVar8) {
      (maxs->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0] =
           (int)lVar8;
    }
    if (lVar8 < (mins->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                array[0]) {
      (mins->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0] =
           (int)lVar8;
    }
    lVar8 = (long)(dVar10 * (double)(int)((uint)(0.0 < dVar1) - (uint)(dVar1 < 0.0)));
    if ((maxs->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1]
        < lVar8) {
      (maxs->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1] =
           (int)lVar8;
    }
    if (lVar8 < (mins->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                array[1]) {
      (mins->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1] =
           (int)lVar8;
    }
    lVar8 = (long)(dVar11 * (double)(int)((uint)(0.0 < dVar2) - (uint)(dVar2 < 0.0)));
    if ((maxs->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2]
        < lVar8) {
      (maxs->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2] =
           (int)lVar8;
    }
    if (lVar8 < (mins->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                array[2]) {
      (mins->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2] =
           (int)lVar8;
    }
  }
  free(affine_cube.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
      );
  free(cuboid.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(affine_basis.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  return;
}

Assistant:

void calculateTiling(std::vector<Eigen::Vector3d> &basis, double x_width, double y_width, double z_width,
                         Eigen::Vector3i &mins, Eigen::Vector3i &maxs) {
        Eigen::MatrixXd affine_basis(3, 4);
        affine_basis << 0.0, 1.0, 0.0, 0.0,
                0.0, 0.0, 1.0, 0.0,
                0.0, 0.0, 0.0, 1.0;

        Eigen::Matrix4d real_basis;
        real_basis << 1.0, 1.0, 1.0, 1.0,
                0.0, basis[0](0), basis[1](0), basis[2](0),
                0.0, basis[0](1), basis[1](1), basis[2](1),
                0.0, basis[0](2), basis[1](2), basis[2](2);

        auto affine_transform_matrix = affine_basis * real_basis.inverse();

        Eigen::MatrixXd cuboid(8, 4);
        cuboid << 1.0, 0.0, 0.0, 0.0,
                1.0, x_width, 0.0, 0.0,
                1.0, 0.0, y_width, 0.0,
                1.0, 0.0, 0.0, z_width,
                1.0, x_width, y_width, 0,
                1.0, x_width, 0.0, z_width,
                1.0, 0.0, y_width, z_width,
                1.0, x_width, y_width, z_width;

        // affine transform the cuboid
        Eigen::MatrixXd affine_cube(8, 3);
        for (int i = 0; i < cuboid.rows(); ++i) {
            Eigen::Vector4d temp_row = cuboid.row(i);
            affine_cube.row(i) = affine_transform_matrix * temp_row;
        }

        // get the limits of the cube in affine space
        long max = std::numeric_limits<long>::min();
        long min = std::numeric_limits<long>::max();

        maxs << max, max, max;
        mins << min, min, min;

        for (int i = 0; i < affine_cube.rows(); ++i) {
            long rnd_x = (long) sgn(affine_cube(i, 0)) * std::ceil(std::abs(affine_cube(i, 0)));
            long rnd_y = (long) sgn(affine_cube(i, 1)) * std::ceil(std::abs(affine_cube(i, 1)));
            long rnd_z = (long) sgn(affine_cube(i, 2)) * std::ceil(std::abs(affine_cube(i, 2)));

            if (rnd_x > maxs(0))
                maxs(0) = rnd_x;
            if (rnd_x < mins(0))
                mins(0) = rnd_x;
            if (rnd_y > maxs(1))
                maxs(1) = rnd_y;
            if (rnd_y < mins(1))
                mins(1) = rnd_y;
            if (rnd_z > maxs(2))
                maxs(2) = rnd_z;
            if (rnd_z < mins(2))
                mins(2) = rnd_z;
        }
    }